

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-fec.c
# Opt level: O0

int poc_encoder(int sock,sockaddr_in *saddr,char *filename)

{
  mp3_frame_t *pmVar1;
  long lVar2;
  long lVar3;
  gf **src;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  adu_t *paVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  ssize_t sVar11;
  int *piVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 *puVar16;
  void *pvVar17;
  float fVar18;
  undefined8 uStack_6030;
  undefined1 auStack_6028 [12];
  int local_601c;
  ulong local_6018;
  long local_6010;
  float local_6008;
  float local_6004;
  float local_6000;
  float local_5ffc;
  FILE *local_5ff8;
  ulong local_5ff0;
  ulong local_5fe8;
  ulong local_5fe0;
  undefined8 local_5fd8;
  float local_5fcc;
  undefined1 local_5fc8 [20];
  float local_5fb4;
  gf **local_5fb0;
  byte local_5fa1;
  undefined1 *local_5fa0;
  uint local_5f98;
  int local_5f94;
  int i;
  unsigned_long len;
  ulong uStack_5f80;
  uint adu_len_1;
  unsigned_long bitrate;
  uchar *ptr;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  uint local_5f58;
  uint local_5f54;
  uint adu_len;
  int i_1;
  unsigned_long group_duration;
  undefined1 local_5f40 [4];
  uint max_len;
  mp3_frame_t mp3_frame;
  unsigned_long start_usec;
  unsigned_long start_sec;
  timeval tv;
  unsigned_long fec_time2;
  unsigned_long fec_time;
  uint cnt;
  unsigned_long __vla_expr0;
  undefined1 local_98 [8];
  aq_t adu_queue;
  fec_t *fec;
  file_t mp3_file;
  int retval;
  char *filename_local;
  sockaddr_in *saddr_local;
  int sock_local;
  
  mp3_file.pos._4_4_ = 1;
  uStack_6030 = 0x10bc3b;
  iVar5 = file_open_read((file_t *)&fec,filename);
  if (iVar5 == 0) {
    uStack_6030 = 0x10bc5c;
    fprintf(_stderr,"Could not open mp3 file: %s\n",filename);
    saddr_local._4_4_ = 0;
  }
  else {
    uStack_6030 = 0x10bc7b;
    adu_queue.size = (unsigned_long)fec_new((uint)fec_k,(uint)fec_n);
    uStack_6030 = 0x10bc8b;
    aq_init((aq_t *)local_98);
    lVar2 = -(ulong)((uint)fec_k * 8 + 0xf & 0xfffffff0);
    fec_time._4_4_ = 0;
    fec_time2 = 0;
    tv.tv_usec = 0;
    local_5fa0 = auStack_6028 + lVar2;
    *(undefined8 *)(auStack_6028 + lVar2 + -8) = 0x10bcf3;
    gettimeofday((timeval *)&start_sec,(__timezone_ptr_t)0x0);
    start_usec = start_sec;
    mp3_frame.raw[0xf98] = (undefined1)tv.tv_sec;
    mp3_frame.raw[0xf99] = tv.tv_sec._1_1_;
    mp3_frame.raw[0xf9a] = tv.tv_sec._2_1_;
    mp3_frame.raw[0xf9b] = tv.tv_sec._3_1_;
    mp3_frame.raw[0xf9c] = tv.tv_sec._4_1_;
    mp3_frame.raw[0xf9d] = tv.tv_sec._5_1_;
    mp3_frame.raw[0xf9e] = tv.tv_sec._6_1_;
    mp3_frame.raw[3999] = tv.tv_sec._7_1_;
    puVar16 = auStack_6028 + lVar2;
    do {
      do {
        do {
          *(undefined8 *)(puVar16 + -8) = 0x10bd1f;
          iVar5 = mp3_next_frame((file_t *)&fec,(mp3_frame_t *)local_5f40);
          local_5fa1 = 0;
          if (0 < iVar5) {
            local_5fa1 = finished != 0 ^ 0xff;
          }
          if ((local_5fa1 & 1) == 0) goto LAB_0010c62e;
          *(undefined8 *)(puVar16 + -8) = 0x10bd62;
          iVar5 = aq_add_frame((aq_t *)local_98,(mp3_frame_t *)local_5f40);
        } while (iVar5 < 1);
        *(undefined8 *)(puVar16 + -8) = 0x10bd77;
        paVar7 = aq_get_adu((aq_t *)local_98);
        *(adu_t **)(local_5fa0 + (ulong)fec_time._4_4_ * 8) = paVar7;
        if (*(long *)(local_5fa0 + (ulong)fec_time._4_4_ * 8) == 0) {
          *(undefined8 *)(puVar16 + -8) = 0x10bdb9;
          __assert_fail("in_adus[cnt] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c",
                        0x68,"int poc_encoder(int, struct sockaddr_in *, char *)");
        }
        fec_time._4_4_ = fec_time._4_4_ + 1;
      } while (fec_time._4_4_ != fec_k);
      group_duration._4_4_ = 0;
      _adu_len = 0;
      for (local_5f54 = 0; (int)local_5f54 < (int)(uint)fec_k; local_5f54 = local_5f54 + 1) {
        pmVar1 = *(mp3_frame_t **)(local_5fa0 + (long)(int)local_5f54 * 8);
        *(undefined8 *)(puVar16 + -8) = 0x10be1e;
        uVar8 = mp3_frame_size(pmVar1);
        local_5f58 = (uint)uVar8;
        if (group_duration._4_4_ < local_5f58) {
          group_duration._4_4_ = local_5f58;
        }
        _adu_len = *(long *)(*(long *)(local_5fa0 + (long)(int)local_5f54 * 8) + 0x4eb8) + _adu_len;
      }
      fec_time2 = _adu_len + fec_time2;
      if (0xfff0 < group_duration._4_4_) {
        *(undefined8 *)(puVar16 + -8) = 0x10beb8;
        __assert_fail("max_len < FEC_PKT_PAYLOAD_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c",0x7b
                      ,"int poc_encoder(int, struct sockaddr_in *, char *)");
      }
      __vla_expr2 = (unsigned_long)(uint)fec_k;
      local_5fb0 = (gf **)(puVar16 + -(ulong)((uint)fec_k * 8 + 0xf & 0xfffffff0));
      ptr = (uchar *)(ulong)(fec_k * group_duration._4_4_);
      uVar8 = (long)local_5fb0 - ((ulong)(ptr + 0xf) & 0xfffffffffffffff0);
      uStack_5f80 = 0;
      bitrate = uVar8;
      __vla_expr1 = (unsigned_long)puVar16;
      for (local_5f54 = 0; (int)local_5f54 < (int)(uint)fec_k; local_5f54 = local_5f54 + 1) {
        pmVar1 = *(mp3_frame_t **)(local_5fa0 + (long)(int)local_5f54 * 8);
        *(undefined8 *)(uVar8 - 8) = 0x10bf65;
        uVar9 = mp3_frame_size(pmVar1);
        uVar10 = bitrate;
        len._4_4_ = (uint)uVar9;
        local_5fb0[(int)local_5f54] = (gf *)bitrate;
        lVar2 = *(long *)(local_5fa0 + (long)(int)local_5f54 * 8);
        *(undefined8 *)(uVar8 - 8) = 0x10bfb4;
        memcpy((void *)uVar10,(void *)(lVar2 + 0x4ec0),uVar9 & 0xffffffff);
        if (len._4_4_ < group_duration._4_4_) {
          pvVar17 = (void *)(bitrate + len._4_4_);
          uVar6 = group_duration._4_4_ - len._4_4_;
          *(undefined8 *)(uVar8 - 8) = 0x10bfe9;
          memset(pvVar17,0,(ulong)uVar6);
        }
        bitrate = bitrate + group_duration._4_4_;
        uStack_5f80 = *(long *)(*(long *)(local_5fa0 + (long)(int)local_5f54 * 8) + 0x4e90) +
                      uStack_5f80;
      }
      uStack_5f80 = uStack_5f80 / fec_k;
      for (local_5f54 = 0; uVar14 = group_duration._4_4_, uVar6 = local_5f54, src = local_5fb0,
          (int)local_5f54 < (int)(uint)fec_n; local_5f54 = local_5f54 + 1) {
        pkt.hdr.packet_seq = (uchar)local_5f54;
        pkt.hdr.fec_k = fec_k;
        pkt.hdr.fec_n = fec_n;
        pkt.hdr.fec_len = (short)group_duration._4_4_ + 2;
        *(undefined8 *)(uVar8 - 8) = 0x10c0de;
        pkt.hdr.group_tstamp = fec_time2;
        fec_encode((fec_t *)adu_queue.size,src,pkt.payload,uVar6,uVar14);
        if ((int)local_5f54 < (int)(uint)fec_k) {
          pmVar1 = *(mp3_frame_t **)(local_5fa0 + (long)(int)local_5f54 * 8);
          *(undefined8 *)(uVar8 - 8) = 0x10c106;
          uVar10 = mp3_frame_size(pmVar1);
          pkt.hdr.len = (unsigned_short)uVar10;
        }
        else {
          pkt.hdr.len = (unsigned_short)group_duration._4_4_;
        }
        *(undefined8 *)(uVar8 - 8) = 0x10c134;
        sVar11 = fec_pkt_sendto(&pkt,sock,(sockaddr *)saddr,0x10);
        if (sVar11 < 0) {
          *(undefined8 *)(uVar8 - 8) = 0x10c13f;
          piVar12 = __errno_location();
          if (*piVar12 != 0x69) {
            *(undefined8 *)(uVar8 - 8) = 0x10c16a;
            perror("Error while sending packet");
            mp3_file.pos._4_4_ = 0;
            local_5f94 = 0xd;
            goto LAB_0010c5fa;
          }
          *(undefined8 *)(uVar8 - 8) = 0x10c15c;
          fprintf(_stderr,"Output buffers full, waiting...\n");
        }
        poc_encoder::wait_time = _adu_len / fec_n + poc_encoder::wait_time;
        tv.tv_usec = _adu_len / fec_n + tv.tv_usec;
        if (1000 < poc_encoder::wait_time) {
          *(undefined8 *)(uVar8 - 8) = 0x10c1df;
          usleep((__useconds_t)poc_encoder::wait_time);
        }
        uVar4 = uStack_5f80;
        if ((quiet == 0) &&
           (uVar6 = poc_encoder::count + 1, uVar14 = poc_encoder::count % 10,
           poc_encoder::count = uVar6, uVar14 == 0)) {
          if (mp3_file.offset == 0) {
            local_6018 = (ulong)tv.tv_usec / 60000000;
            *(undefined8 *)(uVar8 - 8) = 0x10c4df;
            fprintf(_stdout,"\r%02ld:%02ld %ld %3ldkbit/s ",(ulong)tv.tv_usec / 60000000,
                    ((ulong)tv.tv_usec / 1000000) % 0x3c,mp3_file._0_8_,uVar4);
          }
          else {
            local_5ff8 = _stdout;
            local_5ff0 = (ulong)tv.tv_usec / 1000000;
            uVar15 = local_5ff0 / 0x3c;
            uVar13 = local_5ff0 % 0x3c;
            local_5fd8 = 0x20c49ba5e353f7cf;
            local_5fcc = (float)(fec_time2 / 1000);
            local_5fc8._0_8_ = mp3_file._0_8_;
            local_5fc8._8_8_ = mp3_file.offset;
            local_5fc8._16_4_ = (undefined4)(long)mp3_file._0_8_;
            local_5fb4 = (float)(ulong)mp3_file._0_8_;
            local_6008 = local_5fb4;
            local_6004 = local_5fcc / (local_5fb4 + 1.0);
            local_6000 = (float)(long)mp3_file.offset;
            local_5ffc = (float)mp3_file.offset;
            local_6010 = (long)(local_6004 * local_5ffc);
            lVar2 = local_6010 / 60000;
            lVar3 = local_6010 / 1000;
            fVar18 = (local_5fb4 * 100.0) / local_5ffc;
            local_5fe8 = uVar15;
            local_5fe0 = uVar13;
            *(undefined8 *)(uVar8 - 0x20) = mp3_file._0_8_;
            *(unsigned_long *)(uVar8 - 0x18) = mp3_file.offset;
            *(ulong *)(uVar8 - 0x10) = uVar4;
            *(long *)(uVar8 - 8) = (long)fVar18;
            *(undefined8 *)(uVar8 - 0x28) = 0x10c46f;
            fprintf(_stdout,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",uVar15,uVar13
                    ,lVar2,lVar3 % 0x3c);
          }
          *(undefined8 *)(uVar8 - 8) = 0x10c4ee;
          fflush(_stdout);
        }
        *(undefined8 *)(uVar8 - 8) = 0x10c500;
        gettimeofday((timeval *)&start_sec,(__timezone_ptr_t)0x0);
        _i = (start_sec - start_usec) * 1000000 + (tv.tv_sec - mp3_frame.raw._3992_8_);
        poc_encoder::wait_time = poc_encoder::wait_time - _i;
        iVar5 = (int)poc_encoder::wait_time;
        if (iVar5 < 1) {
          iVar5 = -iVar5;
        }
        if (1000000 < iVar5) {
          poc_encoder::wait_time = 0;
        }
        start_usec = start_sec;
        mp3_frame.raw._3992_8_ = tv.tv_sec;
      }
      pkt.hdr.group_seq = pkt.hdr.group_seq + '\x01';
      for (local_5f54 = 0; (int)local_5f54 < (int)(uint)fec_k; local_5f54 = local_5f54 + 1) {
        pvVar17 = *(void **)(local_5fa0 + (long)(int)local_5f54 * 8);
        *(undefined8 *)(uVar8 - 8) = 0x10c5d5;
        free(pvVar17);
      }
      fec_time._4_4_ = 0;
      local_5f94 = 0;
LAB_0010c5fa:
      local_601c = local_5f94;
      puVar16 = (undefined1 *)__vla_expr1;
    } while (local_5f94 == 0);
    if (local_5f94 == 0xd) {
LAB_0010c62e:
      for (local_5f98 = 0; local_5f98 < fec_time._4_4_; local_5f98 = local_5f98 + 1) {
        pvVar17 = *(void **)(local_5fa0 + (long)(int)local_5f98 * 8);
        *(undefined8 *)(puVar16 + -8) = 0x10c65d;
        free(pvVar17);
      }
      *(undefined8 *)(puVar16 + -8) = 0x10c67a;
      aq_destroy((aq_t *)local_98);
      *(undefined8 *)(puVar16 + -8) = 0x10c683;
      fec_free((fec_t *)adu_queue.size);
      *(undefined8 *)(puVar16 + -8) = 0x10c68c;
      file_close((file_t *)&fec);
      saddr_local._4_4_ = mp3_file.pos._4_4_;
    }
  }
  return saddr_local._4_4_;
}

Assistant:

int poc_encoder(int sock, struct sockaddr_in *saddr, char *filename) {
  int retval = 1;
  
  /*M
    Open file for reading.
  **/
  file_t mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  /*M
    Initialize the FEC parameters.
  **/
  fec_t *fec = fec_new(fec_k, fec_n);

  aq_t adu_queue;
  aq_init(&adu_queue);

  adu_t *in_adus[fec_k];
  unsigned int cnt = 0;

  static long wait_time = 0;
  unsigned long fec_time = 0;
  unsigned long fec_time2 = 0;

  /*M
    Get start time.
  **/
  struct timeval tv;
  gettimeofday(&tv, NULL);
  unsigned long start_sec, start_usec;
  start_sec = tv.tv_sec;
  start_usec = tv.tv_usec;
  
  /*M
    Get next MP3 frame and queue it into the ADU queue.
  **/
  mp3_frame_t mp3_frame;
  while ((mp3_next_frame(&mp3_file, &mp3_frame) > 0) && !finished) {
    if (aq_add_frame(&adu_queue, &mp3_frame) > 0) {
      /* a new ADU has been produced */
      in_adus[cnt] = aq_get_adu(&adu_queue);
      assert(in_adus[cnt] != NULL);

      /* check if the FEC group is complete */
      if (++cnt == fec_k) {
        unsigned int max_len = 0;
        unsigned long group_duration = 0;

        int i;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          if (adu_len > max_len)
            max_len = adu_len;

          group_duration += in_adus[i]->usec;
        }

        fec_time += group_duration;

        assert(max_len < FEC_PKT_PAYLOAD_SIZE);

        /* Encode the FEC group */
        unsigned char *in_ptrs[fec_k];
        unsigned char buf[fec_k * max_len];
        unsigned char *ptr = buf;
        unsigned long bitrate = 0;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          in_ptrs[i] = ptr;
          memcpy(ptr, in_adus[i]->raw, adu_len);
          if (adu_len < max_len)
            memset(ptr + adu_len, 0, max_len - adu_len);
          ptr += max_len;
          bitrate += in_adus[i]->bitrate;
        }
        bitrate /= fec_k;

        for (i = 0; i < fec_n; i++) {
          pkt.hdr.packet_seq = i;
          pkt.hdr.fec_k = fec_k;
          pkt.hdr.fec_n = fec_n;
          pkt.hdr.fec_len = max_len + 2;
          pkt.hdr.group_tstamp = fec_time;
          
          fec_encode(fec, in_ptrs, pkt.payload, i, max_len);

          if (i < fec_k) {
            pkt.hdr.len = mp3_frame_size(in_adus[i]);
          } else {
            pkt.hdr.len = max_len;
          }

          /*M
            Simulate packet loss.
          **/
#ifdef DEBUG_PLOSS
          if ((random() % 100) >= ploss_rate ) {
#endif /* DEBUG_PLOSS */

#ifdef DEBUG
            fprintf(stderr,
                    "sending fec packet group stamp %ld, gseq %d, pseq %d, size %d\n",
                    pkt.hdr.group_tstamp, pkt.hdr.group_seq, pkt.hdr.packet_seq, pkt.hdr.len);
#endif
            
            /* send rtp packet */
            if (fec_pkt_sendto(&pkt, sock, (struct sockaddr *)saddr, sizeof(*saddr)) < 0) {
              if (errno == ENOBUFS) {
		fprintf(stderr, "Output buffers full, waiting...\n");
	      } else {
                perror("Error while sending packet");
                
                retval = 0;
                goto exit;
              }
            }
#ifdef DEBUG_PLOSS
          }
#endif /* DEBUG_PLOSS */

          /*M
            Update the time we have to wait.
          **/
          wait_time += (group_duration / fec_n);
          fec_time2 += (group_duration / fec_n);

          /*M
            Sender synchronisation (\verb|sleep| until the next
            packet has to be sent.
          **/
          if (wait_time > 1000)
            usleep(wait_time);

          if (!quiet) {        
            static unsigned int count = 0;
            if ((count++ % 10) == 0) {
              if (mp3_file.size > 0) {
                fprintf(stdout,
                        "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        60000,
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        1000 % 60,
                        
                        mp3_file.offset,
                        mp3_file.size,

                        bitrate,
                        
                        (long)(100*(float)mp3_file.offset/(float)mp3_file.size));
              } else {
                fprintf(stdout, "\r%02ld:%02ld %ld %3ldkbit/s ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        mp3_file.offset,
                        bitrate);
              }
              fflush(stdout);
            }
          }
          
          /*M
            Get length of iteration.
          **/
          gettimeofday(&tv, NULL);
          unsigned long len =
            (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);
          
          wait_time -= len;
          if (abs(wait_time) > MAX_WAIT_TIME)
            wait_time = 0;

          start_sec = tv.tv_sec;
          start_usec = tv.tv_usec;
        }

        pkt.hdr.group_seq++;

        for (i = 0; i < fec_k; i++)
          free(in_adus[i]);

        cnt = 0;
      }
    }
  }

  int i;
 exit:
  for (i = 0; i < cnt; i++)
    free(in_adus[i]);
  
  aq_destroy(&adu_queue);
  fec_free(fec);

  file_close(&mp3_file);

  return retval;
}

/*M
  \emph{Print usage information.}
**/
static void usage(void) {
  fprintf(stderr,
          "Usage: ./poc-fec [-s address] [-p port] [-k fec_k] [-n fec_n] [-q] [-t ttl]");
#ifdef WITH_IPV6
  fprintf(stderr, " [-6]");
#endif /* WITH_IPV6 */
  fprintf(stderr, " files...\n");
  fprintf(stderr, "\t-s address : destination address (default 224.0.1.23 or ff02::4)\n");
  fprintf(stderr, "\t-p port    : destination port (default 1500)\n");
  fprintf(stderr, "\t-q         : quiet\n");
  fprintf(stderr, "\t-t ttl     : multicast ttl (default 1)\n");
  fprintf(stderr, "\t-k fec_k   : FEC k parameter (default 20)\n");
  fprintf(stderr, "\t-n fec_n   : FEC n parameter (default 25)\n");
#ifdef WITH_IPV6
  fprintf(stderr, "\t-6         : use ipv6\n");
#endif /* WITH_IPV6 */
}

/*M
  \emph{Main server routine.}

  Calls the mainloop for each filename given on the command line.
**/
int main(int argc, char *argv[]) {
  int retval = 0;

  char           *address = NULL;
  unsigned short port     = 1500;
  unsigned int   ttl      = 1;

  /*M
    Process the command line arguments.
  **/
  int c;
  while ((c = getopt(argc, argv, "hs:p:t:qP:k:n:"
#ifdef WITH_IPV6
                     "6"
#endif /* WITH_IPV6 */
                     )) >= 0) {
    switch (c) {
#ifdef WITH_IPV6
    case '6':
      use_ipv6 = 1;
      break;
#endif /* WITH_IPV6 */
      
    case 's':
      if (address != NULL)
        free(address);

      address = strdup(optarg);
      break;

    case 'p':
      port = (unsigned short)atoi(optarg);
      break;

    case 'q':
      quiet = 1;
      break;

    case 't':
      ttl = (unsigned int)atoi(optarg);
      break;

    case 'k':
      fec_k = (unsigned int)atoi(optarg);
      break;

    case 'n':
      fec_n = (unsigned int)atoi(optarg);
      break;
      
#ifdef DEBUG_PLOSS
    case 'P':
      {
        static struct timeval tv;
        gettimeofday(&tv, NULL);
        srandom(tv.tv_sec);
        ploss_rate = atoi(optarg);
        break;
      }
#endif /* DEBUG_PLOSS */

    case 'h':
    default:
      usage();
      retval = EXIT_FAILURE;
      goto exit;
    }
  }

  if (fec_n <= fec_k) {
    fprintf(stderr, "fec_n must be bigger than fec_k\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (optind == argc) {
    usage();
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (address == NULL) {
#ifdef WITH_IPV6
    if (use_ipv6)
      address = strdup("ff02::4");
    else
      address = strdup("224.0.1.23");
#else
    address = strdup("224.0.1.23");
#endif /* WITH_IPV6 */
  }

  if (sig_set_handler(SIGINT, sig_int) == SIG_ERR) {
    retval = EXIT_FAILURE;
    goto exit;
  }

  /*M
    Open the sending socket.
  **/
  int sock;
  struct sockaddr_in saddr;
  if (!net_ip4_resolve_hostname(address, port, NULL, &saddr)) {
    fprintf(stderr, "Could not resolve %s\n", address);
    retval = EXIT_FAILURE;
    goto exit;
  }

  sock  = net_udp4_socket(&saddr, port, ttl);
  if (sock < 0) {
    fprintf(stderr, "Could not open socket\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  fec_pkt_init(&pkt);
  
  /*M
    Go through all files given on command line and stream them.
  **/
  int i;
  for (i = optind; (i < argc) && !finished; i++) {
    assert(argv[i] != NULL);
    char filename[MAX_FILENAME];
    strncpy(filename, argv[i], MAX_FILENAME - 1);
    filename[MAX_FILENAME - 1] = '\0';
    
    if (!poc_encoder(sock, &saddr, filename))
      continue;
  }
  
 exit:
  if (address != NULL)
    free(address);
  
  return retval;
}

/*M
 */